

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalDeallocate<false>
          (RepeatedField<unsigned_int> *this)

{
  HeapRep this_00;
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  size_t size;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar4;
  HeapRep *pHVar5;
  size_t bytes;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  RepeatedField<unsigned_int> *local_10;
  RepeatedField<unsigned_int> *this_local;
  
  local_10 = this;
  bVar1 = is_soo(this);
  if (!bVar1) {
    iVar2 = Capacity(this,false);
    size = (long)iVar2 * 4 + 8;
    paVar4 = &heap_rep(this)->field_0;
    if (paVar4->arena == (Arena *)0x0) {
      pHVar5 = heap_rep(this);
      internal::SizedDelete(pHVar5,size);
    }
    else {
      paVar4 = &heap_rep(this)->field_0;
      this_00.field_0 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar4->arena;
      pHVar5 = heap_rep(this);
      Arena::ReturnArrayMemory((Arena *)this_00.field_0,pHVar5,size);
    }
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"!is_soo()");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x263,local_38._M_len,local_38._M_str);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

void InternalDeallocate() {
    ABSL_DCHECK(!is_soo());
    const size_t bytes = Capacity(false) * sizeof(Element) + kHeapRepHeaderSize;
    if (heap_rep()->arena == nullptr) {
      internal::SizedDelete(heap_rep(), bytes);
    } else if (!in_destructor) {
      // If we are in the destructor, we might be being destroyed as part of
      // the arena teardown. We can't try and return blocks to the arena then.
      heap_rep()->arena->ReturnArrayMemory(heap_rep(), bytes);
    }
  }